

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_container_set_range(bitset_container_t *bitset,uint32_t begin,uint32_t end)

{
  uint64_t *puVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  if (begin != end) {
    puVar1 = bitset->words;
    uVar6 = begin >> 6;
    uVar7 = end - 1 >> 6;
    uVar4 = -1L << ((byte)begin & 0x3f);
    if (uVar6 == uVar7) {
      bVar3 = -(char)end;
      uVar5 = (uVar4 << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
      uVar4 = (ulong)uVar6;
    }
    else {
      uVar5 = (ulong)uVar6;
      puVar1[uVar5] = puVar1[uVar5] | uVar4;
      uVar4 = (ulong)uVar7;
      while (uVar5 = uVar5 + 1, uVar5 < uVar4) {
        puVar1[uVar5] = 0xffffffffffffffff;
      }
      uVar5 = 0xffffffffffffffff >> (-(char)end & 0x3fU);
    }
    puVar1[uVar4] = puVar1[uVar4] | uVar5;
  }
  iVar2 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar2;
  return;
}

Assistant:

void bitset_container_set_range(bitset_container_t *bitset, uint32_t begin,
                                uint32_t end) {
    bitset_set_range(bitset->words, begin, end);
    bitset->cardinality =
        bitset_container_compute_cardinality(bitset);  // could be smarter
}